

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

bool cppcms::xss::validate_and_filter_if_invalid
               (char *begin,char *end,rules *r,string *output,filtering_method_type method,
               char repl_ch)

{
  entry *peVar1;
  byte bVar2;
  html_data_type hVar3;
  data *pdVar4;
  pointer pcVar5;
  byte *pbVar6;
  pointer peVar7;
  pointer peVar8;
  rules *r_00;
  bool bVar9;
  bool bVar10;
  int iVar11;
  html_data_type *phVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  char *p;
  byte *pbVar17;
  ulong uVar18;
  string real_encoding;
  string filtered;
  string work_encoding;
  string work_input;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  parsed;
  string tmp;
  string filtered_input;
  string local_130;
  string *local_110;
  char *local_108;
  long local_100;
  char local_f8 [16];
  string local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  char *local_80;
  rules *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pdVar4 = (r->d).ptr_;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  pcVar5 = (pdVar4->encoding)._M_dataplus._M_p;
  local_78 = r;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar5,pcVar5 + (pdVar4->encoding)._M_string_length);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_130._M_dataplus._M_p,
             (char *)(local_130._M_string_length + (long)local_130._M_dataplus._M_p));
  local_c8 = &local_b8;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_108 = local_f8;
  local_100 = 0;
  local_f8[0] = '\0';
  if ((char *)local_130._M_string_length == (char *)0x0) {
    bVar9 = true;
    local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)begin;
  }
  else {
    bVar9 = encoding::is_ascii_compatible(&local_130);
    if (!bVar9) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_e8,0,(char *)local_e8._M_string_length,0x242fb1);
      booster::locale::conv::to_utf<char>
                ((char *)local_70,begin,(string *)end,(method_type)&local_130);
      std::__cxx11::string::swap((string *)&local_c8);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      end = local_c8->_M_local_buf + local_c0;
      repl_ch = '\0';
      begin = (char *)local_c8;
    }
    bVar9 = true;
    bVar10 = encoding::validate_or_filter(&local_e8,begin,end,&local_50,repl_ch);
    local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)begin;
    if (!bVar10) {
      end = local_50._M_dataplus._M_p + local_50._M_string_length;
      bVar9 = false;
      local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_50._M_dataplus._M_p;
    }
  }
  local_a8.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = end;
  anon_unknown_8::split_to_parts(local_88->_M_local_buf,end,&local_a8);
  peVar8 = local_a8.
           super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  peVar7 = local_a8.
           super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar16 = ((long)local_a8.
                  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_a8.
                  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  local_110 = output;
  if (local_a8.
      super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_a8.
      super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar13 = 0;
    uVar18 = 1;
    do {
      peVar1 = peVar7 + uVar13;
      hVar3 = peVar1->type;
      anon_unknown_8::parse_part(peVar1);
      bVar9 = (bool)(bVar9 & hVar3 != invalid_data & peVar1->type != invalid_data);
      bVar10 = uVar18 <= uVar16;
      lVar14 = uVar16 - uVar18;
      uVar13 = uVar18;
      uVar18 = (ulong)((int)uVar18 + 1);
    } while (bVar10 && lVar14 != 0);
  }
  r_00 = local_78;
  anon_unknown_8::validate_nesting(&local_a8,((local_78->d).ptr_)->is_xhtml);
  if (peVar8 == peVar7) {
    bVar10 = true;
    if (bVar9) goto LAB_00220156;
  }
  else {
    phVar12 = &peVar7->type;
    uVar15 = 1;
    do {
      bVar9 = (bool)(bVar9 & *phVar12 != invalid_data);
      uVar13 = (ulong)uVar15;
      phVar12 = phVar12 + 0x12;
      uVar15 = uVar15 + 1;
    } while (uVar13 <= uVar16 && uVar16 - uVar13 != 0);
    if (peVar8 != peVar7) {
      uVar13 = 0;
      uVar18 = 1;
      do {
        peVar1 = peVar7 + uVar13;
        bVar10 = anon_unknown_8::validate_entry_by_rules(peVar1,r_00);
        if (!bVar10) {
          lVar14 = (long)(peVar1->tag).pair;
          if (lVar14 != -1) {
            peVar7[lVar14].type = invalid_data;
          }
          peVar1->type = invalid_data;
          bVar9 = false;
        }
        bVar10 = uVar18 <= uVar16;
        lVar14 = uVar16 - uVar18;
        uVar13 = uVar18;
        uVar18 = (ulong)((int)uVar18 + 1);
      } while (bVar10 && lVar14 != 0);
    }
    bVar10 = true;
    if (bVar9) goto LAB_00220156;
  }
  local_100 = 0;
  *local_108 = '\0';
  std::__cxx11::string::reserve((ulong)&local_108);
  if (peVar8 != peVar7) {
    uVar13 = 0;
    do {
      pbVar17 = (byte *)peVar7[uVar13].begin;
      pbVar6 = (byte *)peVar7[uVar13].end;
      if (peVar7[uVar13].type == invalid_data) {
        if (method != remove_invalid) {
          for (; pbVar17 != pbVar6; pbVar17 = pbVar17 + 1) {
            bVar2 = *pbVar17;
            if (bVar2 < 0x3c) {
              if ((bVar2 != 0x22) && (bVar2 != 0x26)) goto LAB_002200ae;
LAB_002200c2:
              std::__cxx11::string::append((char *)&local_108);
            }
            else {
              if ((bVar2 == 0x3e) || (bVar2 == 0x3c)) goto LAB_002200c2;
LAB_002200ae:
              std::__cxx11::string::push_back((char)&local_108);
            }
          }
        }
      }
      else {
        std::__cxx11::string::append((char *)&local_108,(ulong)pbVar17);
      }
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (uVar13 <= uVar16 && uVar16 - uVar13 != 0);
  }
  if ((local_e8._M_string_length == local_130._M_string_length) &&
     (((char *)local_e8._M_string_length == (char *)0x0 ||
      (iVar11 = bcmp(local_e8._M_dataplus._M_p,local_130._M_dataplus._M_p,local_e8._M_string_length)
      , iVar11 == 0)))) {
    std::__cxx11::string::swap((string *)local_110);
  }
  else {
    booster::locale::conv::from_utf<char>
              ((char *)local_70,local_108,(string *)(local_108 + local_100),(method_type)&local_130)
    ;
    std::__cxx11::string::swap((string *)local_110);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
  }
  bVar10 = false;
LAB_00220156:
  std::
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ::~vector(&local_a8);
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  return bVar10;
}

Assistant:

bool validate_and_filter_if_invalid(	char const *begin,
						char const *end,
						rules const &r,
						std::string &output,
						filtering_method_type method,
						char repl_ch)
	{
		bool valid = true;
		
		std::string real_encoding = r.encoding();
		std::string work_encoding = real_encoding;

		std::string work_input;
		std::string filtered_input;
		std::string filtered;

		if(!real_encoding.empty()) {
			if(!encoding::is_ascii_compatible(real_encoding)) { 
				work_encoding = "UTF-8";
				repl_ch = 0;
				try {
					std::string tmp = 
						booster::locale::conv::to_utf<char>(
							begin,
							end,
							real_encoding,
							booster::locale::conv::stop
							);
					work_input.swap(tmp);
				}
				catch(...) {
					valid = false;
					std::string tmp = 
						booster::locale::conv::to_utf<char>(
							begin,
							end,
							real_encoding,
							booster::locale::conv::skip
							);
					work_input.swap(tmp);
				}
				begin = work_input.c_str();
				end = begin + work_input.size();
			}

			if(!encoding::validate_or_filter(work_encoding,begin,end,filtered_input,repl_ch)) {
				valid = false;
				begin = filtered_input.c_str();
				end = begin + filtered_input.size();
			}
		}

		std::vector<entry> parsed;
		
		split_to_parts(begin,end,parsed);

		size_t size = parsed.size();

		for(unsigned i=0;i<size;i++) {
			if(parsed[i].type == invalid_data)
				valid = false;
			parse_part(parsed[i]);
			if(parsed[i].type == invalid_data)
				valid = false;
		}

		validate_nesting(parsed,r.html() == rules::xhtml_input);

		for(unsigned i=0;i<size;i++)
			if(parsed[i].type == invalid_data)
				valid = false;

		for(unsigned i=0;i<size;i++) {
			if(!validate_entry_by_rules(parsed[i],r)) {
				valid = false;
				int pair = parsed[i].tag.pair;
				if(pair!=-1)
					parsed[pair].type = invalid_data;
				parsed[i].type = invalid_data;
			}
		}
		if(valid)
			return true;
		
		filtered.clear();
		filtered.reserve(end-begin);
		
		for(unsigned i=0;i<size;i++) {
			char const *b=parsed[i].begin;
			char const *e=parsed[i].end;
			if(parsed[i].type == invalid_data) {
				if(method == remove_invalid)
					continue;
				for(char const *p=b;p!=e;p++) {
					char c=*p;
					switch(c) {
					case '<':
						filtered+="&lt;";
						break;
					case '>':
						filtered+="&gt;";
						break;
					case '&':
						filtered+="&amp;";
						break;
					case '"':
						filtered+="&quot;";
						break;
					default:
						filtered+=c;
					}
				}
			}
			else {
				filtered.append(b,e-b);
			}
		}

		if(work_encoding == real_encoding) {
			output.swap(filtered);
		}
		else {
			try {
				std::string tmp = booster::locale::conv::from_utf<char>(
						filtered,
						real_encoding,
						booster::locale::conv::stop);
				output.swap(tmp);
			}
			catch(...) {
				// Nothing to do
			}
		}
		return false;
	}